

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aiman.h
# Opt level: O3

void server::aiman::calcteams(vector<teamscore> *teams)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  teamscore *ptVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  teamscore local_48;
  long local_38;
  
  if (0 < DAT_00193844) {
    lVar9 = 0;
    lVar10 = clients;
    iVar7 = DAT_00193844;
    do {
      lVar3 = *(long *)(lVar10 + lVar9 * 8);
      if ((*(int *)(lVar3 + 0x3c4) != 5) && (*(char *)(lVar3 + 0x124) != '\0')) {
        iVar2 = teams->ulen;
        local_38 = lVar10;
        if (0 < (long)iVar2) {
          ptVar4 = teams->buf;
          lVar10 = 0;
          do {
            iVar6 = strcmp(*(char **)((long)&ptVar4->team + lVar10),(char *)(lVar3 + 0x124));
            if (iVar6 == 0) {
              piVar1 = (int *)((long)&ptVar4->score + lVar10);
              *piVar1 = *piVar1 + 1;
              lVar10 = local_38;
              goto LAB_001444bf;
            }
            lVar10 = lVar10 + 0x10;
          } while ((long)iVar2 * 0x10 != lVar10);
        }
        local_48.score = 1;
        local_48.team = (char *)(lVar3 + 0x124);
        vector<teamscore>::add(teams,&local_48);
        lVar10 = clients;
        iVar7 = DAT_00193844;
      }
LAB_001444bf:
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar7);
  }
  quicksort<teamscore,bool(*)(teamscore_const&,teamscore_const&)>
            (teams->buf,teams->buf + teams->ulen,teamscore::compare);
  if (teams->ulen < 2) {
    lVar10 = 0;
    bVar5 = true;
    do {
      bVar8 = bVar5;
      iVar7 = vector<teamscore>::htfind<char_const*>(teams,autoteam::teamnames + lVar10);
      if (iVar7 < 0) {
        local_48.team = autoteam::teamnames[lVar10];
        local_48.score = 0;
        vector<teamscore>::add(teams,&local_48);
      }
      lVar10 = 1;
      bVar5 = false;
    } while (bVar8);
  }
  return;
}

Assistant:

void calcteams(vector<teamscore> &teams)
    {
        static const char * const defaults[2] = { "good", "evil" };
        loopv(clients)
        {
            clientinfo *ci = clients[i];
            if(ci->state.state==CS_SPECTATOR || !ci->team[0]) continue;
            teamscore *t = NULL;
            loopvj(teams) if(!strcmp(teams[j].team, ci->team)) { t = &teams[j]; break; }
            if(t) t->score++;
            else teams.add(teamscore(ci->team, 1));
        }
        teams.sort(teamscore::compare);
        if(teams.length() < int(sizeof(defaults)/sizeof(defaults[0])))
        {
            loopi(sizeof(defaults)/sizeof(defaults[0])) if(teams.htfind(defaults[i]) < 0) teams.add(teamscore(defaults[i], 0));
        }
    }